

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

char * tun_format(btbb_packet *pkt)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int local_24;
  int i;
  char *tun_format;
  int length;
  btbb_packet *pkt_local;
  
  pcVar4 = (char *)malloc((long)(pkt->payload_length + 9));
  *pcVar4 = (char)pkt->clock;
  pcVar4[1] = (char)(pkt->clock >> 8);
  pcVar4[2] = (char)(pkt->clock >> 0x10);
  pcVar4[3] = (char)(pkt->clock >> 0x18);
  pcVar4[4] = pkt->channel;
  iVar2 = btbb_packet_get_flag(pkt,5);
  iVar3 = btbb_packet_get_flag(pkt,1);
  pcVar4[5] = (byte)iVar2 | (byte)(iVar3 << 1);
  uVar1 = air_to_host8(pkt->packet_header,7);
  pcVar4[6] = uVar1;
  uVar1 = air_to_host8(pkt->packet_header + 7,3);
  pcVar4[7] = uVar1;
  uVar1 = air_to_host8(pkt->packet_header + 10,8);
  pcVar4[8] = uVar1;
  for (local_24 = 0; local_24 < pkt->payload_length; local_24 = local_24 + 1) {
    uVar1 = air_to_host8(pkt->payload + (local_24 << 3),8);
    pcVar4[local_24 + 9] = uVar1;
  }
  return pcVar4;
}

Assistant:

char *tun_format(btbb_packet* pkt)
{
	/* include 6 bytes for meta data, 3 bytes for packet header */
	int length = 9 + pkt->payload_length;
	char *tun_format = (char *) malloc(length);
	int i;

	/* meta data */
	tun_format[0] = pkt->clock & 0xff;
	tun_format[1] = (pkt->clock >> 8) & 0xff;
	tun_format[2] = (pkt->clock >> 16) & 0xff;
	tun_format[3] = (pkt->clock >> 24) & 0xff;
	tun_format[4] = pkt->channel;
	tun_format[5] = btbb_packet_get_flag(pkt, BTBB_CLK27_VALID) |
		(btbb_packet_get_flag(pkt, BTBB_NAP_VALID) << 1);

	/* packet header modified to fit byte boundaries */
	/* lt_addr and type */
	tun_format[6] = (char) air_to_host8(&pkt->packet_header[0], 7);
	/* flags */
	tun_format[7] = (char) air_to_host8(&pkt->packet_header[7], 3);
	/* HEC */
	tun_format[8] = (char) air_to_host8(&pkt->packet_header[10], 8);

	for(i=0;i<pkt->payload_length;i++)
		tun_format[i+9] = (char) air_to_host8(&pkt->payload[i*8], 8);

	return tun_format;
}